

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O2

rx_status rx_handle_test_result
                    (rx_context *context,int result,char *file,int line,rx_severity severity,
                    char *failure_msg,char *diagnostic_msg)

{
  char **__ptr;
  rx_summary *prVar1;
  rx_failure *prVar2;
  rx_status rVar3;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  rx_status rVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  char *file_00;
  char *pcVar9;
  undefined4 in_register_00000084;
  char *buf;
  char *local_40;
  char *local_38;
  
  pcVar9 = (char *)CONCAT44(in_register_00000084,severity);
  pcVar8 = (char *)CONCAT44(in_register_00000034,result);
  prVar1 = context->summary;
  if (prVar1 == (rx_summary *)0x0) {
    __assert_fail("context->summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x186f,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  prVar2 = prVar1->failures;
  if (prVar2 == (rx_failure *)0x0) {
    __assert_fail("context->summary->failures != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1870,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  prVar1->assessed_count = prVar1->assessed_count + 1;
  rVar7 = RX_SUCCESS;
  if (result != 0) {
    return RX_SUCCESS;
  }
  __ptr = &prVar2[-1].msg;
  pcVar5 = prVar2[-1].msg;
  pcVar6 = pcVar5 + 1;
  local_38 = file;
  if ((ulong)pcVar6 >> 0x3b == 0) {
    pcVar8 = prVar2[-1].diagnostic_msg;
    ppcVar4 = __ptr;
    local_40 = failure_msg;
    if (pcVar8 < pcVar6) {
      pcVar5 = pcVar8 + ((ulong)pcVar8 >> 1) + 1;
      if (pcVar5 < pcVar8) {
        pcVar6 = (char *)0x7ffffffffffffff;
      }
      else if ((pcVar6 <= pcVar5) && (pcVar6 = pcVar5, (char *)0x7ffffffffffffff < pcVar5)) {
        __assert_fail("new_capacity <= max_capacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x11ed,
                      "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                     );
      }
      pcVar8 = (char *)((long)pcVar6 << 5 | 0x10);
      ppcVar4 = (char **)realloc(__ptr,(size_t)pcVar8);
      if (ppcVar4 == (char **)0x0) {
        rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x11f3,"failed to reallocate the block\n");
        rVar7 = RX_ERROR_ALLOCATION;
        goto LAB_00102ac2;
      }
      ppcVar4[1] = pcVar6;
      pcVar5 = *ppcVar4;
      pcVar6 = pcVar5 + 1;
    }
    pcVar8 = local_38;
    prVar1->failures = (rx_failure *)(ppcVar4 + 2);
    *ppcVar4 = pcVar6;
    prVar1->failure_count = (rx_size)pcVar6;
    file_00 = local_38;
    rVar3 = rx__str_copy(&buf,local_38);
    pcVar6 = buf;
    if (rVar3 != RX_SUCCESS) {
      rx__log(RX_LOG_LEVEL_ERROR,file_00,0x1891,
              "failed to allocate the file name for the test located at %s:%d\n",pcVar8,
              (ulong)(uint)line);
      pcVar6 = (char *)0x0;
    }
    ppcVar4[(long)pcVar5 * 4 + 2] = pcVar6;
    *(int *)(ppcVar4 + (long)pcVar5 * 4 + 3) = line;
    *(undefined4 *)((long)ppcVar4 + (long)pcVar5 * 0x20 + 0x1c) = 1;
    if (pcVar9 == (char *)0x0) {
      ppcVar4[(long)pcVar5 * 4 + 4] = (char *)0x0;
    }
    else {
      rVar3 = rx__str_copy(&buf,pcVar9);
      pcVar6 = buf;
      if (rVar3 != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ERROR,pcVar9,0x18a5,
                "failed to allocate the failure message for the test located at %s:%d\n",pcVar8,
                (ulong)(uint)line);
        pcVar6 = (char *)0x0;
      }
      ppcVar4[(long)pcVar5 * 4 + 4] = pcVar6;
    }
    if (local_40 == (char *)0x0) {
      ppcVar4[(long)pcVar5 * 4 + 5] = (char *)0x0;
    }
    else {
      pcVar9 = local_40;
      rVar3 = rx__str_copy(&buf,local_40);
      if (rVar3 != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ERROR,pcVar9,0x18b6,
                "failed to allocate the diagnostic message for the test located at %s:%d\n",pcVar8,
                (ulong)(uint)line);
        buf = (char *)0x0;
      }
      ppcVar4[(long)pcVar5 * 4 + 5] = buf;
    }
  }
  else {
    rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x11e2,"the requested capacity is too large\n");
    rVar7 = RX_ERROR_MAX_SIZE_EXCEEDED;
LAB_00102ac2:
    rx__log(RX_LOG_LEVEL_ALL,pcVar8,0x123e,
            "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
            ,*__ptr + 1);
    prVar1->error = "failed to extend the test failure array";
    rx__log(RX_LOG_LEVEL_ERROR,pcVar8,0x1882,
            "failed to extend the test failure array for the test located at %s:%d\n",local_38,
            (ulong)(uint)line);
  }
  return rVar7;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_handle_test_result(struct rx_context *context,
                      int result,
                      const char *file,
                      int line,
                      enum rx_severity severity,
                      const char *failure_msg,
                      const char *diagnostic_msg)
{
    enum rx_status status;
    struct rx_summary *summary;
    struct rx_failure *failure;
    size_t failure_count;

    RX_ASSERT(context != NULL);
    RX_ASSERT(context->summary != NULL);
    RX_ASSERT(context->summary->failures != NULL);
    RX_ASSERT(file != NULL);

    summary = context->summary;

    ++summary->assessed_count;

    if (result) {
        return RX_SUCCESS;
    }

    status
        = rx__test_failure_array_extend_back(&failure, &summary->failures, 1);
    if (status != RX_SUCCESS) {
        summary->error = "failed to extend the test failure array\0";
        RX__LOG_ERROR_2("failed to extend the test failure array for the test "
                        "located at %s:%d\n",
                        file,
                        line);
        return status;
    }

    rx__test_failure_array_get_size(&failure_count, summary->failures);
    summary->failure_count = failure_count;

    {
        char *buf;

        status = rx__str_copy(&buf, file);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the file name for the test "
                            "located at %s:%d\n",
                            file,
                            line);
            failure->file = NULL;
        } else {
            failure->file = buf;
        }
    }

    failure->line = line;
    failure->severity = severity;

    if (failure_msg == NULL) {
        failure->msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, failure_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the failure message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->msg = NULL;
        } else {
            failure->msg = buf;
        }
    }

    if (diagnostic_msg == NULL) {
        failure->diagnostic_msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, diagnostic_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the diagnostic message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->diagnostic_msg = NULL;
        } else {
            failure->diagnostic_msg = buf;
        }
    }

    return RX_SUCCESS;
}